

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,ByteData *hash)

{
  _Rb_tree_header *p_Var1;
  WitnessVersion WVar2;
  size_t sVar3;
  CfdException *this_00;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Pubkey *local_40;
  ByteData *local_38;
  
  this->type_ = type;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = witness_ver;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_90);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->hash_).data_,&hash->data_);
  local_38 = &this->hash_;
  Pubkey::Pubkey(&this->pubkey_);
  local_40 = &this->pubkey_;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  WVar2 = this->witness_ver_;
  if (WVar2 == kVersionNone) {
    return;
  }
  if (WVar2 == kVersion1) {
    sVar3 = ByteData::GetDataSize(hash);
    if (sVar3 == 0x20) {
      this->addr_type_ = kTaprootAddress;
      SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_90,hash);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
                 &local_90);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
      goto LAB_003830aa;
    }
  }
  else if (WVar2 == kVersion0) {
    sVar3 = ByteData::GetDataSize(hash);
    if (sVar3 == 0x14) {
      this->addr_type_ = kP2wpkhAddress;
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,hash);
      ByteData160::ByteData160
                ((ByteData160 *)&local_70,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
      ::std::__cxx11::string::string((string *)&local_90,"",&local_91);
      CalculateP2WPKH(this,(ByteData160 *)&local_70,&local_90);
    }
    else {
      sVar3 = ByteData::GetDataSize(hash);
      if (sVar3 != 0x20) {
        local_70.filename = "cfdcore_address.cpp";
        local_70.line = 0x2eb;
        local_70.funcname = "Address";
        ByteData::GetHex_abi_cxx11_(&local_90,hash);
        logger::info<std::__cxx11::string>
                  (&local_70,"illegal hash data. hash={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&local_90,"hash value error.",(allocator *)&local_70);
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_90);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      this->addr_type_ = kP2wshAddress;
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,hash);
      ByteData256::ByteData256
                ((ByteData256 *)&local_70,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
      ::std::__cxx11::string::string((string *)&local_90,"",&local_91);
      CalculateP2WSH(this,(ByteData256 *)&local_70,&local_90);
    }
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
    return;
  }
  this->addr_type_ = kWitnessUnknown;
LAB_003830aa:
  ::std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_70);
  CalculateBech32m(this,hash,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const ByteData& hash)
    : type_(type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(hash),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));

  if (witness_ver_ == WitnessVersion::kVersion0) {
    if (hash.GetDataSize() == kByteData160Length) {
      SetAddressType(kP2wpkhAddress);
      CalculateP2WPKH(ByteData160(hash.GetBytes()));
    } else if (hash.GetDataSize() == kByteData256Length) {
      SetAddressType(kP2wshAddress);
      CalculateP2WSH(ByteData256(hash.GetBytes()));
    } else {
      // format error
      info(CFD_LOG_SOURCE, "illegal hash data. hash={}", hash.GetHex());
      throw CfdException(kCfdIllegalArgumentError, "hash value error.");
    }
  } else if (witness_ver_ != WitnessVersion::kVersionNone) {
    if ((witness_ver_ == WitnessVersion::kVersion1) &&
        (hash.GetDataSize() == SchnorrPubkey::kSchnorrPubkeySize)) {
      SetAddressType(kTaprootAddress);
      schnorr_pubkey_ = SchnorrPubkey(hash);
    } else {
      SetAddressType(kWitnessUnknown);
    }
    CalculateBech32m(hash);
  }
}